

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O1

QStringList * __thiscall
QAccessibleWidget::actionNames(QStringList *__return_storage_ptr__,QAccessibleWidget *this)

{
  FocusPolicy FVar1;
  long lVar2;
  QWidget *pQVar3;
  QString *args;
  QWidget *this_00;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar2 = (**(code **)(*(long *)this + 0x18))(this);
  if ((*(byte *)(*(long *)(lVar2 + 8) + 0x30) & 1) == 0) {
    lVar2 = 0;
  }
  if ((*(byte *)(*(long *)(lVar2 + 0x20) + 8) & 1) == 0) {
    pQVar3 = (QWidget *)(**(code **)(*(long *)this + 0x18))();
    this_00 = (QWidget *)0x0;
    if ((*(byte *)(*(long *)&pQVar3->field_0x8 + 0x30) & 1) != 0) {
      this_00 = pQVar3;
    }
    FVar1 = QWidget::focusPolicy(this_00);
    if (FVar1 != NoFocus) {
      args = (QString *)QAccessibleActionInterface::setFocusAction();
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,args);
      QList<QString>::end(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QAccessibleWidget::actionNames() const
{
    QStringList names;
    if (widget()->isEnabled()) {
        if (widget()->focusPolicy() != Qt::NoFocus)
            names << setFocusAction();
    }
    return names;
}